

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void free_var_ref(JSRuntime *rt,JSVarRef *var_ref)

{
  int iVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  list_head *plVar4;
  list_head *plVar5;
  JSValue v;
  
  if ((var_ref != (JSVarRef *)0x0) &&
     ((var_ref->field_0).header.ref_count = (var_ref->field_0).header.ref_count + -1,
     (var_ref->field_0).header.ref_count == 0)) {
    if ((((var_ref->field_0).header.dummy1 & 1) != 0) &&
       (iVar2 = (var_ref->value).tag, 0xfffffff4 < (uint)iVar2)) {
      JVar3 = (JSValueUnion)(var_ref->value).u.ptr;
      iVar1 = *JVar3.ptr;
      *(int *)JVar3.ptr = iVar1 + -1;
      if (iVar1 < 2) {
        v.tag = iVar2;
        v.u.ptr = JVar3.ptr;
        __JS_FreeValueRT(rt,v);
      }
    }
    plVar4 = (var_ref->field_0).header.link.prev;
    plVar5 = (var_ref->field_0).header.link.next;
    plVar4->next = plVar5;
    plVar5->prev = plVar4;
    (var_ref->field_0).header.link.prev = (list_head *)0x0;
    (var_ref->field_0).header.link.next = (list_head *)0x0;
    (*(rt->mf).js_free)(&rt->malloc_state,var_ref);
    return;
  }
  return;
}

Assistant:

static void free_var_ref(JSRuntime *rt, JSVarRef *var_ref)
{
    if (var_ref) {
        assert(var_ref->header.ref_count > 0);
        if (--var_ref->header.ref_count == 0) {
            if (var_ref->is_detached) {
                JS_FreeValueRT(rt, var_ref->value);
                remove_gc_object(&var_ref->header);
            } else {
                list_del(&var_ref->header.link); /* still on the stack */
            }
            js_free_rt(rt, var_ref);
        }
    }
}